

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void AdjustOpenGLLogicalScalingPoint(int *x,int *y)

{
  SDL_Rect SVar1;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int adjusted_y;
  int adjusted_x;
  float scale_y;
  float scale_x;
  int physical_h;
  int physical_w;
  SDL_Rect viewport;
  int *y_local;
  int *x_local;
  
  if ((OpenGLLogicalScalingFBO != 0) && (VideoWindow20 != (SDL_Window *)0x0)) {
    viewport._8_8_ = y;
    (*SDL20_GetWindowSize)(VideoWindow20,(int *)&scale_x,(int *)&scale_y);
    SVar1 = GetOpenGLLogicalScalingViewport((int)scale_x,(int)scale_y);
    viewport.x = SVar1.w;
    viewport.y = SVar1.h;
    physical_h = SVar1.x;
    local_58 = (int)((float)(*x - physical_h) *
                    ((float)OpenGLLogicalScalingWidth / (float)viewport.x));
    physical_w = SVar1.y;
    local_64 = (int)((float)(*(int *)viewport._8_8_ - physical_w) *
                    ((float)OpenGLLogicalScalingHeight / (float)viewport.y));
    local_54 = local_58;
    if (OpenGLLogicalScalingWidth <= local_58) {
      local_54 = OpenGLLogicalScalingWidth;
    }
    if (local_54 < 1) {
      local_5c = 0;
    }
    else {
      if (OpenGLLogicalScalingWidth <= local_58) {
        local_58 = OpenGLLogicalScalingWidth;
      }
      local_5c = local_58;
    }
    *x = local_5c;
    local_60 = local_64;
    if (OpenGLLogicalScalingHeight <= local_64) {
      local_60 = OpenGLLogicalScalingHeight;
    }
    if (local_60 < 1) {
      local_68 = 0;
    }
    else {
      if (OpenGLLogicalScalingHeight <= local_64) {
        local_64 = OpenGLLogicalScalingHeight;
      }
      local_68 = local_64;
    }
    *(int *)viewport._8_8_ = local_68;
  }
  return;
}

Assistant:

static void
AdjustOpenGLLogicalScalingPoint(int *x, int *y)
{
    SDL_Rect viewport;
    int physical_w, physical_h;
    float scale_x, scale_y;
    int adjusted_x, adjusted_y;

    /* Don't adjust anything if we're not using Logical Scaling */
    if (!OpenGLLogicalScalingFBO || !VideoWindow20) {
        return;
    }

    /* we want to scale based on the window size, which is dpi-scaled */
    SDL20_GetWindowSize(VideoWindow20, &physical_w, &physical_h);
    viewport = GetOpenGLLogicalScalingViewport(physical_w, physical_h);

    scale_x = (float)OpenGLLogicalScalingWidth / viewport.w;
    scale_y = (float)OpenGLLogicalScalingHeight / viewport.h;

    adjusted_x = (int) ((*x - viewport.x) * scale_x);
    adjusted_y = (int) ((*y - viewport.y) * scale_y);

    /* Clamp the result to the visible window */
    *x = SDL_max(SDL_min(adjusted_x, OpenGLLogicalScalingWidth), 0);
    *y = SDL_max(SDL_min(adjusted_y, OpenGLLogicalScalingHeight), 0);
}